

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocating_handler.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::
allocating_handler<libtorrent::aux::session_impl::on_udp_packet(std::weak_ptr<libtorrent::aux::session_udp_socket>,std::weak_ptr<libtorrent::aux::listen_socket_t>,libtorrent::aux::transport,boost::system::error_code_const&)::$_0,192ul,(libtorrent::aux::HandlerName)6>
::operator()(allocating_handler<libtorrent::aux::session_impl::on_udp_packet(std::weak_ptr<libtorrent::aux::session_udp_socket>,std::weak_ptr<libtorrent::aux::listen_socket_t>,libtorrent::aux::transport,boost::system::error_code_const&)::__0,192ul,(libtorrent::aux::HandlerName)6>
             *this,error_code *a)

{
  system_error *e;
  exception *e_1;
  runtime_error e_2;
  error_code *a_local;
  allocating_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:2691:35),_192UL,_(libtorrent::aux::HandlerName)6>
  *this_local;
  
  allocating_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:2691:35),_192UL,_(libtorrent::aux::HandlerName)6>
  ::anon_class_48_4_809fa5c2_for_handler::operator()((anon_class_48_4_809fa5c2_for_handler *)this,a)
  ;
  return;
}

Assistant:

void operator()(A&&... a)
		{
#ifdef BOOST_NO_EXCEPTIONS
			handler(std::forward<A>(a)...);
#else
			try
			{
				handler(std::forward<A>(a)...);
			}
			catch (system_error const& e)
			{
				error_handler->on_error(e.code());
			}
			catch (std::exception const& e)
			{
				error_handler->on_exception(e);
			}
			catch (...)
			{
				// this is pretty bad
				TORRENT_ASSERT(false);
				std::runtime_error e("unknown exception");
				error_handler->on_exception(e);
			}
#endif
		}